

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmBinaryOp(LlvmCompilationContext *ctx,ExprBinaryOp *node)

{
  int iVar1;
  ExpressionContext *pEVar2;
  bool bVar3;
  LLVMValueRef pLVar4;
  long lVar5;
  TypeBase *pTVar6;
  TypeBase *pTVar7;
  TypeBase *pTVar8;
  
  CompileLlvm(ctx,node->lhs);
  iVar1 = *(int *)&(node->super_ExprBase).field_0x2c;
  if ((iVar1 == 0x13) || (iVar1 == 0x12)) {
    pTVar6 = node->lhs->type;
    pEVar2 = ctx->ctx;
    lVar5 = 0x89d8;
    if ((pEVar2->typeBool == pTVar6) ||
       ((pEVar2->typeChar == pTVar6 || (pEVar2->typeShort == pTVar6)))) {
LAB_00192c7a:
      pTVar6 = *(TypeBase **)((long)(pEVar2->uniqueDependencies).little + lVar5 + -0x30);
    }
    else if (pEVar2->typeFloat == pTVar6) {
      lVar5 = 0x89f0;
      goto LAB_00192c7a;
    }
    CompileLlvmType(ctx,pTVar6);
    CompileLlvm(ctx,node->rhs);
    pTVar6 = node->rhs->type;
    pEVar2 = ctx->ctx;
    lVar5 = 0x89d8;
    if (((pEVar2->typeBool == pTVar6) || (pEVar2->typeChar == pTVar6)) ||
       (pEVar2->typeShort == pTVar6)) {
LAB_00192ccb:
      pTVar6 = *(TypeBase **)((long)(pEVar2->uniqueDependencies).little + lVar5 + -0x30);
    }
    else if (pEVar2->typeFloat == pTVar6) {
      lVar5 = 0x89f0;
      goto LAB_00192ccb;
    }
    CompileLlvmType(ctx,pTVar6);
    CompileLlvmType(ctx,ctx->ctx->typeInt);
    pTVar6 = ctx->ctx->typeInt;
LAB_00192cf3:
    CompileLlvmType(ctx,pTVar6);
LAB_00192cfb:
    pTVar6 = ctx->ctx->typeInt;
LAB_00192d05:
    CompileLlvmType(ctx,pTVar6);
  }
  else {
    CompileLlvm(ctx,node->rhs);
    switch(*(undefined4 *)&(node->super_ExprBase).field_0x2c) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
      ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type);
      break;
    case 6:
      pTVar6 = (node->super_ExprBase).type;
      pEVar2 = ctx->ctx;
      lVar5 = 0x89d8;
      if (((pEVar2->typeBool == pTVar6) || (pEVar2->typeChar == pTVar6)) ||
         (pEVar2->typeShort == pTVar6)) {
LAB_00192e25:
        pTVar8 = *(TypeBase **)((long)(pEVar2->uniqueDependencies).little + lVar5 + -0x30);
      }
      else {
        pTVar8 = pTVar6;
        if (pEVar2->typeFloat == pTVar6) {
          lVar5 = 0x89f0;
          goto LAB_00192e25;
        }
      }
      pTVar7 = pEVar2->typeInt;
      if ((pTVar8 == pTVar7) || ((pTVar6 != (TypeBase *)0x0 && (pTVar6->typeID == 0x19)))) break;
      if ((pEVar2->typeBool == pTVar6) || (pEVar2->typeChar == pTVar6)) {
        lVar5 = 0x89d8;
        if (pTVar7 == pEVar2->typeLong) break;
LAB_00192f62:
        pTVar6 = *(TypeBase **)((long)(pEVar2->uniqueDependencies).little + lVar5 + -0x30);
      }
      else {
        if (pEVar2->typeShort == pTVar6) {
LAB_00192f32:
          if (pTVar7 == pEVar2->typeLong) break;
          if (pEVar2->typeChar != pTVar6) goto LAB_00192f44;
LAB_00192f5d:
          lVar5 = 0x89d8;
          goto LAB_00192f62;
        }
        if (pEVar2->typeFloat == pTVar6) {
          pTVar7 = pEVar2->typeDouble;
          goto LAB_00192f32;
        }
        if (pTVar6 == pEVar2->typeLong) break;
LAB_00192f44:
        if (pEVar2->typeShort == pTVar6) goto LAB_00192f5d;
        if (pEVar2->typeFloat == pTVar6) {
          lVar5 = 0x89f0;
          goto LAB_00192f62;
        }
      }
      if (pTVar6 != pEVar2->typeDouble) {
        __assert_fail("!\"unknown operand type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0x4e8,
                      "LLVMValueRef CompileLlvmBinaryOp(LlvmCompilationContext &, ExprBinaryOp *)");
      }
      break;
    case 7:
    case 8:
    case 0xf:
    case 0x10:
    case 0x11:
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type);
      goto LAB_00192cfb;
    case 0xd:
    case 0xe:
      pTVar6 = node->lhs->type;
      if (((((pTVar6 != (TypeBase *)0x0) && (pTVar6->typeID == 0x12)) ||
           (bVar3 = ExpressionContext::IsIntegerType(ctx->ctx,pTVar6), bVar3)) ||
          ((pTVar6 = node->lhs->type, pTVar6 != (TypeBase *)0x0 && (pTVar6->typeID == 0x19)))) ||
         (pTVar6 == ctx->ctx->typeTypeID)) goto LAB_00192cfb;
      pTVar6 = ctx->ctx->typeInt;
      goto LAB_00192d05;
    default:
      __assert_fail("result",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x529,
                    "LLVMValueRef CompileLlvmBinaryOp(LlvmCompilationContext &, ExprBinaryOp *)");
    case 0x14:
      pTVar6 = node->lhs->type;
      pEVar2 = ctx->ctx;
      lVar5 = 0x89d8;
      if (((pEVar2->typeBool == pTVar6) || (pEVar2->typeChar == pTVar6)) ||
         (pEVar2->typeShort == pTVar6)) {
LAB_00192ec6:
        pTVar6 = *(TypeBase **)((long)(pEVar2->uniqueDependencies).little + lVar5 + -0x30);
      }
      else if (pEVar2->typeFloat == pTVar6) {
        lVar5 = 0x89f0;
        goto LAB_00192ec6;
      }
      CompileLlvmType(ctx,pTVar6);
      pTVar6 = node->rhs->type;
      pEVar2 = ctx->ctx;
      lVar5 = 0x89d8;
      if (((pEVar2->typeBool == pTVar6) || (pEVar2->typeChar == pTVar6)) ||
         (pEVar2->typeShort == pTVar6)) {
LAB_00192f0f:
        pTVar6 = *(TypeBase **)((long)(pEVar2->uniqueDependencies).little + lVar5 + -0x30);
      }
      else if (pEVar2->typeFloat == pTVar6) {
        lVar5 = 0x89f0;
        goto LAB_00192f0f;
      }
      goto LAB_00192cf3;
    }
  }
  pLVar4 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
  return pLVar4;
}

Assistant:

LLVMValueRef CompileLlvmBinaryOp(LlvmCompilationContext &ctx, ExprBinaryOp *node)
{
	LLVMValueRef lhs = CompileLlvm(ctx, node->lhs);

	if(node->op == SYN_BINARY_OP_LOGICAL_AND)
	{
		LLVMBasicBlockRef checkRhsBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "land_check_rhs");
		LLVMBasicBlockRef storeOneBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "land_store_1");
		LLVMBasicBlockRef storeZeroBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "land_store_0");
		LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "land_exit");

		lhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->lhs->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, lhs, checkRhsBlock, storeZeroBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, checkRhsBlock);

		LLVMValueRef rhs = CompileLlvm(ctx, node->rhs);

		rhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, rhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->rhs->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, lhs, storeOneBlock, storeZeroBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, storeOneBlock);

		LLVMBuildBr(ctx.builder, exitBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, storeZeroBlock);

		LLVMBuildBr(ctx.builder, exitBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

		LLVMValueRef phi = LLVMBuildPhi(ctx.builder, CompileLlvmType(ctx, ctx.ctx.typeInt), "land");

		LLVMValueRef values[] = { LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 1, true), LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 0, true) };
		LLVMBasicBlockRef blocks[] = { storeOneBlock, storeZeroBlock };

		LLVMAddIncoming(phi, values, blocks, 2);

		return CheckType(ctx, node, phi);
	}

	if(node->op == SYN_BINARY_OP_LOGICAL_OR)
	{
		LLVMBasicBlockRef checkRhsBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "lor_check_rhs");
		LLVMBasicBlockRef storeOneBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "lor_store_1");
		LLVMBasicBlockRef storeZeroBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "lor_store_0");
		LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "lor_exit");

		lhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->lhs->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, lhs, storeOneBlock, checkRhsBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, checkRhsBlock);

		LLVMValueRef rhs = CompileLlvm(ctx, node->rhs);

		rhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, rhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->rhs->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, lhs, storeOneBlock, storeZeroBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, storeOneBlock);

		LLVMBuildBr(ctx.builder, exitBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, storeZeroBlock);

		LLVMBuildBr(ctx.builder, exitBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

		LLVMValueRef phi = LLVMBuildPhi(ctx.builder, CompileLlvmType(ctx, ctx.ctx.typeInt), "lor");

		LLVMValueRef values[] = { LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 1, true), LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 0, true) };
		LLVMBasicBlockRef blocks[] = { storeOneBlock, storeZeroBlock };

		LLVMAddIncoming(phi, values, blocks, 2);

		return CheckType(ctx, node, phi);
	}

	LLVMValueRef rhs = CompileLlvm(ctx, node->rhs);

	LLVMValueRef result = NULL;

	switch(node->op)
	{
	case SYN_BINARY_OP_ADD:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildAdd(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFAdd(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_SUB:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildSub(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFSub(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_MUL:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildMul(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFMul(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_DIV:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildSDiv(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFDiv(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_MOD:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildSRem(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFRem(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_POW:
		if(GetStackType(ctx, node->type) == ctx.ctx.typeInt || isType<TypeEnum>(node->type))
		{
			LLVMValueRef arguments[] = { lhs, rhs };

			result = LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmPowInt"), arguments, 2, "");
		}
		else if(GetStackType(ctx, node->type) == ctx.ctx.typeLong)
		{
			LLVMValueRef arguments[] = { lhs, rhs };

			result = LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmPowLong"), arguments, 2, "");
		}
		else if(GetStackType(ctx, node->type) == ctx.ctx.typeDouble)
		{
			LLVMValueRef arguments[] = { lhs, rhs };

			result = LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmPowDouble"), arguments, 2, "");
		}
		else
		{
			assert(!"unknown operand type");
		}
		break;
	case SYN_BINARY_OP_SHL:
		result = LLVMBuildShl(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_SHR:
		result = LLVMBuildAShr(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_LESS:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntSLT, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealULT, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_LESS_EQUAL:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntSLE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealULE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_GREATER:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntSGT, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealUGT, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_GREATER_EQUAL:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntSGE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealUGE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_EQUAL:
		if(isType<TypeRef>(node->lhs->type) || ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type) || node->lhs->type == ctx.ctx.typeTypeID)
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntEQ, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealUEQ, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_NOT_EQUAL:
		if(isType<TypeRef>(node->lhs->type) || ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type) || node->lhs->type == ctx.ctx.typeTypeID)
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealUNE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_BIT_AND:
		result = LLVMBuildAnd(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_BIT_OR:
		result = LLVMBuildOr(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_BIT_XOR:
		result = LLVMBuildXor(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_LOGICAL_XOR:
		// (lhs != 0) != (rhs != 0)
		lhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->lhs->type)), 0, true), "");
		rhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, rhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->rhs->type)), 0, true), "");

		result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	default:
		break;
	}

	assert(result);

	return CheckType(ctx, node, result);
}